

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

DisableStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DisableStatementSyntax,slang::syntax::NamedLabelSyntax*&,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::syntax::NameSyntax&,slang::parsing::Token&>
          (BumpAllocator *this,NamedLabelSyntax **args,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1,Token *args_2,
          NameSyntax *args_3,Token *args_4)

{
  Token disable;
  Token semi;
  DisableStatementSyntax *this_00;
  
  this_00 = (DisableStatementSyntax *)allocate(this,0x70,8);
  disable.kind = args_2->kind;
  disable._2_1_ = args_2->field_0x2;
  disable.numFlags.raw = (args_2->numFlags).raw;
  disable.rawLen = args_2->rawLen;
  disable.info = args_2->info;
  semi.kind = args_4->kind;
  semi._2_1_ = args_4->field_0x2;
  semi.numFlags.raw = (args_4->numFlags).raw;
  semi.rawLen = args_4->rawLen;
  semi.info = args_4->info;
  slang::syntax::DisableStatementSyntax::DisableStatementSyntax
            (this_00,*args,args_1,disable,args_3,semi);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }